

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O3

vocwdef * vocfnw(voccxdef *voccx,vocseadef *search_ctx)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  vocwdef *pvVar4;
  vocdef *pvVar5;
  uint uVar6;
  long lVar7;
  bool bVar8;
  
  pvVar5 = search_ctx->v;
  uVar3 = search_ctx->vw->vocwnxt;
  if (uVar3 == 0xffffffff) {
    pvVar4 = (vocwdef *)0x0;
  }
  else {
    pvVar4 = (vocwdef *)
             ((long)&voccx->voccxwp[(ulong)uVar3 / 2000]->vocwnxt + (ulong)(uVar3 % 2000 << 3));
  }
  if (pvVar5 != (vocdef *)0x0) {
    bVar8 = false;
    do {
      if (bVar8) {
        uVar3 = search_ctx->len1;
        bVar1 = pvVar5->voclen;
        if (uVar3 == 0 && bVar1 == 0) {
LAB_001f0abc:
          uVar3 = search_ctx->len2;
          bVar2 = pvVar5->vocln2;
          if (uVar3 == 0 && bVar2 == 0) {
LAB_001f0b16:
            uVar3 = pvVar5->vocwlst;
            if (uVar3 != 0xffffffff) {
              pvVar4 = (vocwdef *)
                       ((long)&voccx->voccxwp[(ulong)uVar3 / 2000]->vocwnxt +
                       (ulong)(uVar3 % 2000 << 3));
              goto LAB_001f0b41;
            }
            goto LAB_001f0b86;
          }
          if ((uVar3 != 0) && (bVar2 != 0)) {
            uVar6 = uVar3;
            if (bVar2 < uVar3) {
              uVar6 = (uint)bVar2;
            }
            if (uVar3 < 6) {
              uVar6 = (uint)bVar2;
            }
            if (uVar6 == uVar3) {
              lVar7 = 0;
              do {
                if (search_ctx->wrd2[lVar7] != pvVar5->voctxt[lVar7 + (ulong)bVar1])
                goto LAB_001f0b88;
                lVar7 = lVar7 + 1;
              } while (uVar3 != (uint)lVar7);
              goto LAB_001f0b16;
            }
          }
        }
        else if ((uVar3 != 0) && (bVar1 != 0)) {
          uVar6 = uVar3;
          if (bVar1 < uVar3) {
            uVar6 = (uint)bVar1;
          }
          if (uVar3 < 6) {
            uVar6 = (uint)bVar1;
          }
          if (uVar6 == uVar3) {
            lVar7 = 0;
            do {
              if (search_ctx->wrd1[lVar7] != pvVar5->voctxt[lVar7]) goto LAB_001f0b88;
              lVar7 = lVar7 + 1;
            } while (uVar3 != (uint)lVar7);
            goto LAB_001f0abc;
          }
        }
      }
      else {
LAB_001f0b41:
        if (pvVar4 != (vocwdef *)0x0) {
          do {
            if ((search_ctx->vw->vocwtyp == pvVar4->vocwtyp) && ((pvVar4->vocwflg & 9) == 0))
            goto LAB_001f0b9b;
            uVar3 = pvVar4->vocwnxt;
          } while ((uVar3 != 0xffffffff) &&
                  (pvVar4 = voccx->voccxwp[(ulong)uVar3 / 2000] + uVar3 % 2000,
                  voccx->voccxwp[(ulong)uVar3 / 2000] != (vocwdef *)0x0));
        }
LAB_001f0b86:
        pvVar4 = (vocwdef *)0x0;
      }
LAB_001f0b88:
      pvVar5 = pvVar5->vocnxt;
      bVar8 = true;
    } while (pvVar5 != (vocdef *)0x0);
  }
  pvVar5 = (vocdef *)0x0;
  pvVar4 = (vocwdef *)0x0;
LAB_001f0b9b:
  search_ctx->v = pvVar5;
  search_ctx->vw = pvVar4;
  return pvVar4;
}

Assistant:

vocwdef *vocfnw(voccxdef *voccx, vocseadef *search_ctx)
{
    vocdef  *v, *vf;
    vocwdef *vw, *vwf;
    vocdef  *c = search_ctx->v;
    int      first;

    /* continue with current word's vocwdef list if anything is left */
    first = TRUE;
    vw = vocwget(voccx, search_ctx->vw->vocwnxt);

    /* keep going until we run out of hash chain entries or find a match */
    for (v = c, vf = 0 ; v != 0 && vf == 0 ; v = v->vocnxt, first = FALSE)
    {
        /* if this word matches, look at the objects in its list */
        if (first
            || (voceq(search_ctx->wrd1, search_ctx->len1,
                      v->voctxt, v->voclen)
                && voceq(search_ctx->wrd2, search_ctx->len2,
                         v->voctxt + v->voclen, v->vocln2)))
        {
            /*
             *   on the first time through, vw has already been set up
             *   with the next vocwdef in the current list; on subsequent
             *   times through the loop, start at the head of the current
             *   word's list 
             */
            if (!first)
                vw = vocwget(voccx, v->vocwlst);

            /* search the list from vw forward */
            for ( ; vw ; vw = vocwget(voccx, vw->vocwnxt))
            {
                if (search_ctx->vw->vocwtyp == vw->vocwtyp
                    && !(vw->vocwflg & VOCFCLASS)
                    && !(vw->vocwflg & VOCFDEL))
                {
                    /*
                     *   remember the first vocdef that we found, and
                     *   remember this, the first matching vocwdef, then
                     *   stop scanning 
                     */
                    vf = v;
                    vwf = vw;
                    break;
                }
            }
        }
    }

    /* return the first vocwdef in this word's list */
    search_ctx->v = vf;
    search_ctx->vw = (vf ? vwf : 0);
    return(search_ctx->vw);
}